

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void DefaultFormatter::Unser<DataStream,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (DataStream *s,vector<unsigned_char,_std::allocator<unsigned_char>_> *t)

{
  long lVar1;
  long in_FS_OFFSET;
  DataStream *in_stack_00000010;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
            (in_stack_00000010,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Unser(Stream& s, T& t) { Unserialize(s, t); }